

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_checker.cc
# Opt level: O0

bool __thiscall dd::SequenceCheckerImpl::IsCurrent(SequenceCheckerImpl *this)

{
  AutoLock local_38;
  AutoLock lock;
  void *current_system_queue;
  PlatformThreadRef current_thread;
  TaskQueueBase *current_queue;
  SequenceCheckerImpl *this_local;
  
  current_queue = (TaskQueueBase *)this;
  current_thread = (PlatformThreadRef)TaskQueueBase::Current();
  current_system_queue = (void *)CurrentThreadRef();
  lock._lock = (Lock *)GetSystemQueueRef();
  AutoLock::AutoLock(&local_38,&this->_lock);
  if ((this->_attached & 1U) == 0) {
    this->_attached = true;
    this->_valid_thread = (PlatformThreadRef)current_system_queue;
    this->_valid_queue = (TaskQueueBase *)current_thread;
    this->_valid_system_queue = lock._lock;
    this_local._7_1_ = true;
  }
  else if ((this->_valid_queue == (TaskQueueBase *)0x0) && (current_thread == 0)) {
    if ((this->_valid_system_queue == (void *)0x0) ||
       ((Lock *)this->_valid_system_queue != lock._lock)) {
      this_local._7_1_ =
           IsThreadRefEqual(&this->_valid_thread,(PlatformThreadRef *)&current_system_queue);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = this->_valid_queue == (TaskQueueBase *)current_thread;
  }
  AutoLock::~AutoLock(&local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SequenceCheckerImpl::IsCurrent() const
	{
		const TaskQueueBase* const current_queue = TaskQueueBase::Current();
		const PlatformThreadRef current_thread = CurrentThreadRef();
		const void* const current_system_queue = GetSystemQueueRef();
		AutoLock lock(_lock);
		if (!_attached)
		{
			_attached = true;
			_valid_thread = current_thread;
			_valid_queue = current_queue;
			_valid_system_queue = current_system_queue;
			return true;
		}
		if (_valid_queue || current_queue)
			return _valid_queue == current_queue;
		if (_valid_system_queue && _valid_system_queue == current_system_queue)
			return true;
		return IsThreadRefEqual(_valid_thread, current_thread);
	}